

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::resolveObjectsInStream(QPDF *this,int obj_stream_number)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer pMVar6;
  size_type sVar7;
  QPDFExc *pQVar8;
  mapped_type *pmVar9;
  element_type *buf;
  element_type *peVar10;
  qpdf_offset_t qVar11;
  char *pcVar12;
  qpdf_offset_t qVar13;
  reference __t;
  __tuple_element_t<0UL,_tuple<int,_long_long,_unsigned_long>_> *p_Var14;
  __tuple_element_t<1UL,_tuple<int,_long_long,_unsigned_long>_> *p_Var15;
  __tuple_element_t<2UL,_tuple<int,_long_long,_unsigned_long>_> *p_Var16;
  pointer ppVar17;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar18;
  bool local_d7a;
  QPDFObjectHandle local_d20;
  QPDFObjGen local_d10;
  undefined1 local_d08 [8];
  QPDFObjectHandle oh;
  string local_cf0;
  undefined1 local_cd0 [8];
  OffsetBuffer in;
  Buffer obj_buffer;
  _Self local_b28;
  iterator entry;
  QPDFObjGen og;
  type *obj_size;
  type *obj_offset;
  type *obj_id;
  __normal_iterator<std::tuple<int,_long_long,_unsigned_long>_*,_std::vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>_>
  local_af8;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
  *__range1;
  long local_ad8;
  unsigned_long local_ad0;
  long local_ac8;
  string local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  QPDFExc local_a60;
  string local_9e0;
  string local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  QPDFExc local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  QPDFExc local_880;
  undefined4 local_800;
  allocator<char> local_7f9;
  string local_7f8;
  QPDFExc local_7d8;
  long local_758;
  longlong offset;
  int num;
  undefined1 local_728 [8];
  Token toffset;
  qpdf_offset_t id_offset;
  Token tnum;
  uint i;
  bool is_first;
  longlong last_offset;
  int id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  uchar *local_578;
  uchar *b_start;
  qpdf_offset_t end_offset;
  size_t b_size;
  string local_558;
  undefined1 local_538 [8];
  BufferInputSource input;
  shared_ptr<Buffer> bp;
  vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
  offsets;
  string local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  byte local_35c;
  byte local_35b;
  byte local_35a;
  allocator<char> local_359;
  string local_358 [32];
  QPDFObjectHandle local_338;
  allocator<char> local_321;
  string local_320 [32];
  QPDFObjectHandle local_300;
  int local_2f0;
  uint local_2ec;
  int first;
  uint n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  QPDFExc local_228;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  undefined1 local_158 [8];
  QPDFObjectHandle dict;
  qpdf_offset_t end_after_space;
  qpdf_offset_t end_before_space;
  QPDFObjGen stream_og;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  QPDFObjectHandle local_58;
  undefined1 local_48 [8];
  Stream obj_stream;
  undefined1 local_28 [8];
  anon_class_16_2_1298170d damaged;
  int obj_stream_number_local;
  QPDF *this_local;
  
  local_28 = (undefined1  [8])this;
  damaged.this._0_4_ = obj_stream_number;
  damaged._12_4_ = obj_stream_number;
  pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                    (&pMVar6->resolved_object_streams,(key_type *)&damaged.field_0xc);
  if (sVar7 == 0) {
    pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pVar18 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       (&pMVar6->resolved_object_streams,(value_type_conflict3 *)&damaged.field_0xc)
    ;
    obj_stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar18.first._M_node;
    getObject((QPDF *)&local_58,(int)this,damaged._12_4_);
    QPDFObjectHandle::as_stream((QPDFObjectHandle *)local_48,(typed)&local_58);
    QPDFObjectHandle::~QPDFObjectHandle(&local_58);
    bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_48);
    if (!bVar2) {
      stream_og.obj._3_1_ = 1;
      pQVar8 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::to_string(&local_c8,damaged._12_4_);
      std::operator+(&local_a8,"object ",&local_c8);
      std::operator+(&local_88,&local_a8," 0");
      std::__cxx11::to_string((string *)&stream_og.gen,damaged._12_4_);
      std::operator+(&local_108,"supposed object stream ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stream_og.gen);
      std::operator+(&local_e8,&local_108," is not a stream");
      damagedPDF(pQVar8,this,&local_88,&local_e8);
      stream_og.obj._3_1_ = 0;
      __cxa_throw(pQVar8,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    QPDFObjGen::QPDFObjGen((QPDFObjGen *)((long)&end_before_space + 4),damaged._12_4_,0);
    pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pmVar9 = std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::operator[](&pMVar6->obj_cache,(key_type *)((long)&end_before_space + 4));
    qVar11 = pmVar9->end_before_space;
    pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pmVar9 = std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::operator[](&pMVar6->obj_cache,(key_type *)((long)&end_before_space + 4));
    dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pmVar9->end_after_space;
    ::qpdf::Stream::getDict((Stream *)local_158);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"/ObjStm",&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1a1);
    bVar2 = QPDFObjectHandle::isDictionaryOfType
                      ((QPDFObjectHandle *)local_158,&local_178,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      QTC::TC("qpdf","QPDF ERR object stream with wrong type",0);
      std::__cxx11::to_string(&local_288,damaged._12_4_);
      std::operator+(&local_268,"object ",&local_288);
      std::operator+(&local_248,&local_268," 0");
      std::__cxx11::to_string((string *)&first,damaged._12_4_);
      std::operator+(&local_2c8,"supposed object stream ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&first);
      std::operator+(&local_2a8,&local_2c8," has wrong type");
      damagedPDF(&local_228,this,&local_248,&local_2a8);
      warn(this,&local_228);
      QPDFExc::~QPDFExc(&local_228);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&first);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
    }
    local_2ec = 0;
    local_2f0 = 0;
    std::allocator<char>::allocator();
    local_35a = 0;
    local_35b = 0;
    local_35c = 0;
    std::__cxx11::string::string<std::allocator<char>>(local_320,"/N",&local_321);
    QPDFObjectHandle::getKey(&local_300,(string *)local_158);
    bVar2 = QPDFObjectHandle::getValueAsUInt(&local_300,&local_2ec);
    local_d7a = false;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_35a = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_358,"/First",&local_359);
      local_35b = 1;
      QPDFObjectHandle::getKey(&local_338,(string *)local_158);
      local_35c = 1;
      local_d7a = QPDFObjectHandle::getValueAsInt(&local_338,&local_2f0);
    }
    if ((local_35c & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_338);
    }
    if ((local_35b & 1) != 0) {
      std::__cxx11::string::~string(local_358);
    }
    if ((local_35a & 1) != 0) {
      std::allocator<char>::~allocator(&local_359);
    }
    QPDFObjectHandle::~QPDFObjectHandle(&local_300);
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator(&local_321);
    if (((local_d7a ^ 0xffU) & 1) != 0) {
      pQVar8 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::to_string(&local_3c0,damaged._12_4_);
      std::operator+(&local_3a0,"object ",&local_3c0);
      std::operator+(&local_380,&local_3a0," 0");
      std::__cxx11::to_string(&local_420,damaged._12_4_);
      std::operator+(&local_400,"object stream ",&local_420);
      std::operator+(&local_3e0,&local_400," has incorrect keys");
      damagedPDF(pQVar8,this,&local_380,&local_3e0);
      __cxa_throw(pQVar8,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    std::
    vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
    ::vector((vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
              *)&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::qpdf::Stream::getStreamData((Stream *)&input.max_offset,(qpdf_stream_decode_level_e)local_48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"",(allocator<char> *)((long)&b_size + 7));
    buf = std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&input.max_offset);
    BufferInputSource::BufferInputSource((BufferInputSource *)local_538,&local_558,buf,false);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator((allocator<char> *)((long)&b_size + 7));
    peVar10 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &input.max_offset);
    b_start = (uchar *)Buffer::getSize(peVar10);
    end_offset = (qpdf_offset_t)b_start;
    peVar10 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &input.max_offset);
    local_578 = Buffer::getBuffer(peVar10);
    if ((long)b_start <= (long)local_2f0) {
      last_offset._7_1_ = 1;
      pQVar8 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::to_string(&local_5d8,damaged._12_4_);
      std::operator+(&local_5b8,"object ",&local_5d8);
      std::operator+(&local_598,&local_5b8," 0");
      std::__cxx11::to_string((string *)&id,damaged._12_4_);
      std::operator+(&local_618,"object stream ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id);
      std::operator+(&local_5f8,&local_618," has invalid /First entry");
      damagedPDF(pQVar8,this,&local_598,&local_5f8);
      last_offset._7_1_ = 0;
      __cxa_throw(pQVar8,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    last_offset._0_4_ = 0;
    _i = -1;
    tnum.error_message.field_2._M_local_buf[0xf] = '\x01';
    for (tnum.error_message.field_2._8_4_ = 0; (uint)tnum.error_message.field_2._8_4_ < local_2ec;
        tnum.error_message.field_2._8_4_ = tnum.error_message.field_2._8_4_ + 1) {
      readToken((Token *)&id_offset,this,(InputSource *)local_538,0);
      toffset.error_message.field_2._8_8_ = InputSource::getLastOffset((InputSource *)local_538);
      readToken((Token *)local_728,this,(InputSource *)local_538,0);
      bVar2 = QPDFTokenizer::Token::isInteger((Token *)&id_offset);
      if ((!bVar2) || (bVar2 = QPDFTokenizer::Token::isInteger((Token *)local_728), !bVar2)) {
        offset._6_1_ = 1;
        pQVar8 = (QPDFExc *)__cxa_allocate_exception(0x80);
        qVar11 = InputSource::getLastOffset((InputSource *)local_538);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&num,"expected integer in object stream header",
                   (allocator<char> *)((long)&offset + 7));
        resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                  (pQVar8,(anon_class_16_2_1298170d *)local_28,0,qVar11,(string *)&num);
        offset._6_1_ = 0;
        __cxa_throw(pQVar8,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)&id_offset);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      offset._0_4_ = QUtil::string_to_int(pcVar12);
      QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)local_728);
      pcVar12 = (char *)std::__cxx11::string::c_str();
      iVar4 = QUtil::string_to_int(pcVar12);
      iVar5 = (int)offset;
      local_758 = (long)iVar4;
      if ((int)offset == damaged._12_4_) {
        QTC::TC("qpdf","QPDF ignore self-referential object stream",0);
        uVar1 = toffset.error_message.field_2._8_8_;
        iVar5 = (int)offset;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7f8,"object stream claims to contain itself",&local_7f9);
        resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                  (&local_7d8,(anon_class_16_2_1298170d *)local_28,iVar5,uVar1,&local_7f8);
        warn(this,&local_7d8);
        QPDFExc::~QPDFExc(&local_7d8);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::allocator<char>::~allocator(&local_7f9);
        local_800 = 4;
      }
      else if ((int)offset < 1) {
        QTC::TC("qpdf","QPDF object stream contains id < 1",0);
        uVar1 = toffset.error_message.field_2._8_8_;
        iVar5 = (int)offset;
        s_abi_cxx11_(&local_8a0,"object id is invalid",0x14);
        resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                  (&local_880,(anon_class_16_2_1298170d *)local_28,iVar5,uVar1,&local_8a0);
        warn(this,&local_880);
        QPDFExc::~QPDFExc(&local_880);
        std::__cxx11::string::~string((string *)&local_8a0);
        local_800 = 4;
      }
      else if (_i < local_758) {
        pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        iVar4 = (int)offset;
        if (pMVar6->xref_table_max_id < iVar5) {
          local_800 = 4;
        }
        else if (local_2f0 + local_758 < (long)b_start) {
          if ((tnum.error_message.field_2._M_local_buf[0xf] & 1U) == 0) {
            local_ac8 = _i + local_2f0;
            local_ad0 = local_758 - _i;
            std::
            vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
            ::emplace_back<int&,long_long,unsigned_long>
                      ((vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
                        *)&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (int *)&last_offset,&local_ac8,&local_ad0);
          }
          else {
            tnum.error_message.field_2._M_local_buf[0xf] = '\0';
          }
          _i = local_758;
          last_offset._0_4_ = (int)offset;
          local_800 = 0;
        }
        else {
          qVar13 = InputSource::getLastOffset((InputSource *)local_538);
          std::__cxx11::to_string(&local_ac0,local_758);
          std::operator+(&local_aa0,"offset ",&local_ac0);
          std::operator+(&local_a80,&local_aa0," is too large");
          resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                    (&local_a60,(anon_class_16_2_1298170d *)local_28,iVar4,qVar13,&local_a80);
          warn(this,&local_a60);
          QPDFExc::~QPDFExc(&local_a60);
          std::__cxx11::string::~string((string *)&local_a80);
          std::__cxx11::string::~string((string *)&local_aa0);
          std::__cxx11::string::~string((string *)&local_ac0);
          local_800 = 4;
        }
      }
      else {
        QTC::TC("qpdf","QPDF object stream offsets not increasing",0);
        iVar5 = (int)offset;
        qVar13 = InputSource::getLastOffset((InputSource *)local_538);
        std::__cxx11::to_string(&local_9c0,local_758);
        std::operator+(&local_9a0,"offset ",&local_9c0);
        std::operator+(&local_980,&local_9a0," is invalid (must be larger than previous offset ");
        std::__cxx11::to_string(&local_9e0,_i);
        std::operator+(&local_960,&local_980,&local_9e0);
        std::operator+(&local_940,&local_960,")");
        resolveObjectsInStream::anon_class_16_2_1298170d::operator()
                  (&local_920,(anon_class_16_2_1298170d *)local_28,iVar5,qVar13,&local_940);
        warn(this,&local_920);
        QPDFExc::~QPDFExc(&local_920);
        std::__cxx11::string::~string((string *)&local_940);
        std::__cxx11::string::~string((string *)&local_960);
        std::__cxx11::string::~string((string *)&local_9e0);
        std::__cxx11::string::~string((string *)&local_980);
        std::__cxx11::string::~string((string *)&local_9a0);
        std::__cxx11::string::~string((string *)&local_9c0);
        local_800 = 4;
      }
      QPDFTokenizer::Token::~Token((Token *)local_728);
      QPDFTokenizer::Token::~Token((Token *)&id_offset);
    }
    if ((tnum.error_message.field_2._M_local_buf[0xf] & 1U) == 0) {
      local_ad8 = _i + local_2f0;
      __range1 = (vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
                  *)(end_offset - (_i + local_2f0));
      std::
      vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
      ::emplace_back<int&,long_long,unsigned_long>
                ((vector<std::tuple<int,long_long,unsigned_long>,std::allocator<std::tuple<int,long_long,unsigned_long>>>
                  *)&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (int *)&last_offset,&local_ad8,(unsigned_long *)&__range1);
    }
    this_00 = &bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __end1 = std::
             vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
             ::begin((vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
                      *)this_00);
    local_af8._M_current =
         (tuple<int,_long_long,_unsigned_long> *)
         std::
         vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
         ::end((vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
                *)this_00);
    while (bVar2 = __gnu_cxx::operator!=(&__end1,&local_af8), bVar2) {
      __t = __gnu_cxx::
            __normal_iterator<std::tuple<int,_long_long,_unsigned_long>_*,_std::vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>_>
            ::operator*(&__end1);
      p_Var14 = std::get<0ul,int,long_long,unsigned_long>(__t);
      p_Var15 = std::get<1ul,int,long_long,unsigned_long>(__t);
      p_Var16 = std::get<2ul,int,long_long,unsigned_long>(__t);
      QPDFObjGen::QPDFObjGen((QPDFObjGen *)&entry,*p_Var14,0);
      pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      local_b28._M_node =
           (_Base_ptr)
           std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::find(&pMVar6->xref_table,(key_type *)&entry);
      pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      obj_buffer.m._M_t.
      super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
           (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
           std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::end(&pMVar6->xref_table);
      bVar3 = std::operator!=(&local_b28,(_Self *)&obj_buffer);
      bVar2 = false;
      if (bVar3) {
        ppVar17 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator->
                            (&local_b28);
        iVar5 = QPDFXRefEntry::getType(&ppVar17->second);
        bVar2 = false;
        if (iVar5 == 2) {
          ppVar17 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator->
                              (&local_b28);
          iVar5 = QPDFXRefEntry::getObjStreamNumber(&ppVar17->second);
          bVar2 = iVar5 == damaged._12_4_;
        }
      }
      if (bVar2) {
        Buffer::Buffer((Buffer *)&in.global_offset,local_578 + *p_Var15,*p_Var16);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_cf0,"",
                   (allocator<char> *)
                   ((long)&oh.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        ::qpdf::is::OffsetBuffer::OffsetBuffer
                  ((OffsetBuffer *)local_cd0,&local_cf0,(Buffer *)&in.global_offset,*p_Var15);
        std::__cxx11::string::~string((string *)&local_cf0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&oh.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        readObjectInStream((QPDF *)local_d08,(OffsetBuffer *)this,(int)local_cd0,damaged._12_4_);
        local_d10 = (QPDFObjGen)entry._M_node;
        QPDFObjectHandle::getObj(&local_d20);
        updateCache(this,local_d10,(shared_ptr<QPDFObject> *)&local_d20,qVar11,
                    (qpdf_offset_t)
                    dict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                    true);
        std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)&local_d20);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d08);
        ::qpdf::is::OffsetBuffer::~OffsetBuffer((OffsetBuffer *)local_cd0);
        Buffer::~Buffer((Buffer *)&in.global_offset);
      }
      else {
        QTC::TC("qpdf","QPDF not caching overridden objstm object",0);
      }
      __gnu_cxx::
      __normal_iterator<std::tuple<int,_long_long,_unsigned_long>_*,_std::vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>_>
      ::operator++(&__end1);
    }
    BufferInputSource::~BufferInputSource((BufferInputSource *)local_538);
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&input.max_offset);
    std::
    vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
    ::~vector((vector<std::tuple<int,_long_long,_unsigned_long>,_std::allocator<std::tuple<int,_long_long,_unsigned_long>_>_>
               *)&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_158);
    ::qpdf::Stream::~Stream((Stream *)local_48);
  }
  return;
}

Assistant:

void
QPDF::resolveObjectsInStream(int obj_stream_number)
{
    auto damaged =
        [this, obj_stream_number](int id, qpdf_offset_t offset, std::string const& msg) -> QPDFExc {
        return {
            qpdf_e_damaged_pdf,
            m->file->getName() + " object stream " + std::to_string(obj_stream_number),
            +"object " + std::to_string(id) + " 0",
            offset,
            msg,
            true};
    };

    if (m->resolved_object_streams.count(obj_stream_number)) {
        return;
    }
    m->resolved_object_streams.insert(obj_stream_number);
    // Force resolution of object stream
    auto obj_stream = getObject(obj_stream_number, 0).as_stream();
    if (!obj_stream) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "supposed object stream " + std::to_string(obj_stream_number) + " is not a stream");
    }

    // For linearization data in the object, use the data from the object stream for the objects in
    // the stream.
    QPDFObjGen stream_og(obj_stream_number, 0);
    qpdf_offset_t end_before_space = m->obj_cache[stream_og].end_before_space;
    qpdf_offset_t end_after_space = m->obj_cache[stream_og].end_after_space;

    QPDFObjectHandle dict = obj_stream.getDict();
    if (!dict.isDictionaryOfType("/ObjStm")) {
        QTC::TC("qpdf", "QPDF ERR object stream with wrong type");
        warn(damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "supposed object stream " + std::to_string(obj_stream_number) + " has wrong type"));
    }

    unsigned int n{0};
    int first{0};
    if (!(dict.getKey("/N").getValueAsUInt(n) && dict.getKey("/First").getValueAsInt(first))) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "object stream " + std::to_string(obj_stream_number) + " has incorrect keys");
    }

    // id, offset, size
    std::vector<std::tuple<int, qpdf_offset_t, size_t>> offsets;

    auto bp = obj_stream.getStreamData(qpdf_dl_specialized);

    BufferInputSource input("", bp.get());

    const auto b_size = bp->getSize();
    const auto end_offset = static_cast<qpdf_offset_t>(b_size);
    auto b_start = bp->getBuffer();

    if (first >= end_offset) {
        throw damagedPDF(
            "object " + std::to_string(obj_stream_number) + " 0",
            "object stream " + std::to_string(obj_stream_number) + " has invalid /First entry");
    }

    int id = 0;
    long long last_offset = -1;
    bool is_first = true;
    for (unsigned int i = 0; i < n; ++i) {
        auto tnum = readToken(input);
        auto id_offset = input.getLastOffset();
        auto toffset = readToken(input);
        if (!(tnum.isInteger() && toffset.isInteger())) {
            throw damaged(0, input.getLastOffset(), "expected integer in object stream header");
        }

        int num = QUtil::string_to_int(tnum.getValue().c_str());
        long long offset = QUtil::string_to_int(toffset.getValue().c_str());

        if (num == obj_stream_number) {
            QTC::TC("qpdf", "QPDF ignore self-referential object stream");
            warn(damaged(num, id_offset, "object stream claims to contain itself"));
            continue;
        }

        if (num < 1) {
            QTC::TC("qpdf", "QPDF object stream contains id < 1");
            warn(damaged(num, id_offset, "object id is invalid"s));
            continue;
        }

        if (offset <= last_offset) {
            QTC::TC("qpdf", "QPDF object stream offsets not increasing");
            warn(damaged(
                num,
                input.getLastOffset(),
                "offset " + std::to_string(offset) +
                    " is invalid (must be larger than previous offset " +
                    std::to_string(last_offset) + ")"));
            continue;
        }

        if (num > m->xref_table_max_id) {
            continue;
        }

        if (first + offset >= end_offset) {
            warn(damaged(
                num, input.getLastOffset(), "offset " + std::to_string(offset) + " is too large"));
            continue;
        }

        if (is_first) {
            is_first = false;
        } else {
            offsets.emplace_back(
                id, last_offset + first, static_cast<size_t>(offset - last_offset));
        }

        last_offset = offset;
        id = num;
    }

    if (!is_first) {
        // We found at least one valid entry.
        offsets.emplace_back(
            id, last_offset + first, b_size - static_cast<size_t>(last_offset + first));
    }

    // To avoid having to read the object stream multiple times, store all objects that would be
    // found here in the cache.  Remember that some objects stored here might have been overridden
    // by new objects appended to the file, so it is necessary to recheck the xref table and only
    // cache what would actually be resolved here.
    for (auto const& [obj_id, obj_offset, obj_size]: offsets) {
        QPDFObjGen og(obj_id, 0);
        auto entry = m->xref_table.find(og);
        if (entry != m->xref_table.end() && entry->second.getType() == 2 &&
            entry->second.getObjStreamNumber() == obj_stream_number) {
            Buffer obj_buffer{b_start + obj_offset, obj_size};
            is::OffsetBuffer in("", &obj_buffer, obj_offset);
            auto oh = readObjectInStream(in, obj_stream_number, obj_id);
            updateCache(og, oh.getObj(), end_before_space, end_after_space);
        } else {
            QTC::TC("qpdf", "QPDF not caching overridden objstm object");
        }
    }
}